

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

uint8_t av1_drl_ctx(uint16_t *ref_mv_weight,int ref_idx)

{
  int ref_idx_local;
  uint16_t *ref_mv_weight_local;
  uint8_t local_1;
  
  if ((ref_mv_weight[ref_idx] < 0x280) || (ref_mv_weight[ref_idx + 1] < 0x280)) {
    if ((ref_mv_weight[ref_idx] < 0x280) || (0x27f < ref_mv_weight[ref_idx + 1])) {
      if ((ref_mv_weight[ref_idx] < 0x280) && (ref_mv_weight[ref_idx + 1] < 0x280)) {
        local_1 = '\x02';
      }
      else {
        local_1 = '\0';
      }
    }
    else {
      local_1 = '\x01';
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static inline uint8_t av1_drl_ctx(const uint16_t *ref_mv_weight, int ref_idx) {
  if (ref_mv_weight[ref_idx] >= REF_CAT_LEVEL &&
      ref_mv_weight[ref_idx + 1] >= REF_CAT_LEVEL)
    return 0;

  if (ref_mv_weight[ref_idx] >= REF_CAT_LEVEL &&
      ref_mv_weight[ref_idx + 1] < REF_CAT_LEVEL)
    return 1;

  if (ref_mv_weight[ref_idx] < REF_CAT_LEVEL &&
      ref_mv_weight[ref_idx + 1] < REF_CAT_LEVEL)
    return 2;

  return 0;
}